

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

ZSTD_CDict *
duckdb_zstd::ZSTD_createCDict_advanced
          (void *dictBuffer,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_compressionParameters cParams,
          ZSTD_customMem customMem)

{
  ZSTD_compressionParameters ZVar1;
  ZSTD_CDict *pZVar2;
  ZSTD_CCtx_params local_100;
  
  ZVar1 = cParams;
  switchD_012e3010::default(&local_100,0,0xd8);
  local_100.fParams.contentSizeFlag = 1;
  local_100.cParams.windowLog = cParams.windowLog;
  local_100.cParams.chainLog = cParams.chainLog;
  local_100.cParams.hashLog = ZVar1.hashLog;
  local_100.cParams.searchLog = ZVar1.searchLog;
  local_100.cParams.minMatch = ZVar1.minMatch;
  local_100.cParams.targetLength = cParams.targetLength;
  local_100.cParams.strategy = cParams.strategy;
  local_100.customMem.customAlloc = customMem.customAlloc;
  local_100.customMem.customFree = customMem.customFree;
  local_100.customMem.opaque = customMem.opaque;
  pZVar2 = ZSTD_createCDict_advanced2
                     (dictBuffer,dictSize,dictLoadMethod,dictContentType,&local_100,customMem);
  return pZVar2;
}

Assistant:

ZSTD_CDict* ZSTD_createCDict_advanced(const void* dictBuffer, size_t dictSize,
                                      ZSTD_dictLoadMethod_e dictLoadMethod,
                                      ZSTD_dictContentType_e dictContentType,
                                      ZSTD_compressionParameters cParams,
                                      ZSTD_customMem customMem)
{
    ZSTD_CCtx_params cctxParams;
    ZSTD_memset(&cctxParams, 0, sizeof(cctxParams));
    ZSTD_CCtxParams_init(&cctxParams, 0);
    cctxParams.cParams = cParams;
    cctxParams.customMem = customMem;
    return ZSTD_createCDict_advanced2(
        dictBuffer, dictSize,
        dictLoadMethod, dictContentType,
        &cctxParams, customMem);
}